

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

lineiter_t * lineiter_start(FILE *fh)

{
  int iVar1;
  lineiter_t *plVar2;
  char *pcVar3;
  size_t __n;
  
  plVar2 = (lineiter_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                          ,0x10c);
  pcVar3 = (char *)__ckd_malloc__(0x80,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                                  ,0x10d);
  plVar2->buf = pcVar3;
  *pcVar3 = '\0';
  plVar2->bsiz = 0x80;
  plVar2->len = 0;
  plVar2->fh = fh;
  plVar2 = lineiter_next(plVar2);
  if (plVar2 != (lineiter_t *)0x0) {
    pcVar3 = plVar2->buf;
    iVar1 = strncmp(pcVar3,anon_var_dwarf_1a6f2,3);
    if (iVar1 == 0) {
      __n = strlen(pcVar3 + 1);
      memmove(pcVar3,pcVar3 + 3,__n);
      plVar2->len = plVar2->len + -3;
    }
  }
  return plVar2;
}

Assistant:

lineiter_t *
lineiter_start(FILE *fh)
{
    lineiter_t *li;

    li = (lineiter_t *)ckd_calloc(1, sizeof(*li));
    li->buf = (char *)ckd_malloc(128);
    li->buf[0] = '\0';
    li->bsiz = 128;
    li->len = 0;
    li->fh = fh;

    li = lineiter_next(li);
    
    /* Strip the UTF-8 BOM */
    
    if (li && 0 == strncmp(li->buf, "\xef\xbb\xbf", 3)) {
	memmove(li->buf, li->buf + 3, strlen(li->buf + 1));
	li->len -= 3;
    }
    
    return li;
}